

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

bool P_ActivateLine(line_t_conflict *line,AActor *mo,int side,int activationType,DVector3 *optpos)

{
  bool bVar1;
  byte special_00;
  uint useAgain;
  int iVar2;
  int iVar3;
  bool local_48;
  bool local_47;
  bool remote;
  BYTE special;
  INTBOOL buttonSuccess;
  INTBOOL repeat;
  int lineActivation;
  DVector3 *optpos_local;
  int activationType_local;
  int side_local;
  AActor *mo_local;
  line_t_conflict *line_local;
  
  bVar1 = P_TestActivateLine(line,mo,side,activationType,optpos);
  if (bVar1) {
    local_47 = false;
    if ((line->special != 7) && (local_47 = false, line->special != 8)) {
      local_48 = true;
      if (10 < line->special) {
        local_48 = 0xe < line->special;
      }
      local_47 = local_48;
    }
    if ((line->locknumber < 1) || (bVar1 = P_CheckKeys(mo,line->locknumber,local_47), bVar1)) {
      useAgain = line->flags & 0x200;
      iVar2 = P_ExecuteSpecial(line->special,(line_t *)line,mo,side == 1,line->args[0],line->args[1]
                               ,line->args[2],line->args[3],line->args[4]);
      special_00 = (byte)line->special;
      if ((useAgain == 0) && (iVar2 != 0)) {
        line->special = 0;
      }
      if (iVar2 == 0) {
        if (((((activationType == 8) && ((level.flags2 & 0x400000) != 0)) && (useAgain == 0)) &&
            (((special_00 < 200 || (0xcd < special_00)) &&
             ((special_00 != 0 &&
              ((bVar1 = FTagManager::LineHasID(&tagManager,line,line->args[0]), bVar1 &&
               (line->args[0] != 0)))))))) &&
           (iVar3 = P_FindFirstSectorFromTag(line->args[0]), iVar3 == -1)) {
          P_ChangeSwitchTexture(line->sidedef[0],0,special_00,(bool *)0x0);
          line->special = 0;
        }
      }
      else if (((activationType == 2) || (activationType == 8)) || (activationType == 0x10)) {
        P_ChangeSwitchTexture(line->sidedef[0],useAgain,special_00,(bool *)0x0);
      }
      iVar3 = FIntCVar::operator_cast_to_int(&developer);
      if ((3 < iVar3) && (iVar2 != 0)) {
        Printf("Line special %d activated on line %i\n",(ulong)special_00,
               ((long)line - (long)lines) / 0x98 & 0xffffffff);
      }
      line_local._7_1_ = true;
    }
    else {
      line_local._7_1_ = false;
    }
  }
  else {
    line_local._7_1_ = false;
  }
  return line_local._7_1_;
}

Assistant:

bool P_ActivateLine (line_t *line, AActor *mo, int side, int activationType, DVector3 *optpos)
{
	int lineActivation;
	INTBOOL repeat;
	INTBOOL buttonSuccess;
	BYTE special;

	if (!P_TestActivateLine (line, mo, side, activationType, optpos))
	{
		return false;
	}
	bool remote = (line->special != 7 && line->special != 8 && (line->special < 11 || line->special > 14));
	if (line->locknumber > 0 && !P_CheckKeys (mo, line->locknumber, remote)) return false;
	lineActivation = line->activation;
	repeat = line->flags & ML_REPEAT_SPECIAL;
	buttonSuccess = false;
	buttonSuccess = P_ExecuteSpecial(line->special,
					line, mo, side == 1, line->args[0],
					line->args[1], line->args[2],
					line->args[3], line->args[4]);

	special = line->special;
	if (!repeat && buttonSuccess)
	{ // clear the special on non-retriggerable lines
		line->special = 0;
	}

	if (buttonSuccess)
	{
		if (activationType == SPAC_Use || activationType == SPAC_Impact || activationType == SPAC_Push)
		{
			P_ChangeSwitchTexture (line->sidedef[0], repeat, special);
		}
	}
	// some old WADs use this method to create walls that change the texture when shot.
	else if (activationType == SPAC_Impact &&					// only for shootable triggers
		(level.flags2 & LEVEL2_DUMMYSWITCHES) &&				// this is only a compatibility setting for an old hack!
		!repeat &&												// only non-repeatable triggers
		(special<Generic_Floor || special>Generic_Crusher) &&	// not for Boom's generalized linedefs
		special &&												// not for lines without a special
		tagManager.LineHasID(line, line->args[0]) &&							// Safety check: exclude edited UDMF linedefs or ones that don't map the tag to args[0]
		line->args[0] &&										// only if there's a tag (which is stored in the first arg)
		P_FindFirstSectorFromTag (line->args[0]) == -1)			// only if no sector is tagged to this linedef
	{
		P_ChangeSwitchTexture (line->sidedef[0], repeat, special);
		line->special = 0;
	}
// end of changed code
	if (developer >= DMSG_SPAMMY && buttonSuccess)
	{
		Printf ("Line special %d activated on line %i\n", special, int(line - lines));
	}
	return true;
}